

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

QJsonArray QJsonArray::fromStringList(QStringList *list)

{
  undefined1 uVar1;
  const_iterator o;
  QString *value;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QJsonArray *array;
  const_iterator it;
  QString *in_stack_ffffffffffffff78;
  QList<QString> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray((QJsonArray *)0x4869b7);
  local_28[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28[0] = QList<QString>::constBegin(in_stack_ffffffffffffff80);
  while( true ) {
    o = QList<QString>::constEnd(in_stack_ffffffffffffff80);
    uVar1 = QList<QString>::const_iterator::operator!=(local_28,o);
    if (!(bool)uVar1) break;
    value = QList<QString>::const_iterator::operator*(local_28);
    QJsonValue::QJsonValue((QJsonValue *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    append((QJsonArray *)CONCAT17(uVar1,in_stack_ffffffffffffff90),(QJsonValue *)value);
    QJsonValue::~QJsonValue((QJsonValue *)0x486a3d);
    QList<QString>::const_iterator::operator++(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonArray QJsonArray::fromStringList(const QStringList &list)
{
    QJsonArray array;
    for (QStringList::const_iterator it = list.constBegin(); it != list.constEnd(); ++it)
        array.append(QJsonValue(*it));
    return array;
}